

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

stack * stack_new(int startingSize)

{
  ulong uVar1;
  stack *__ptr;
  void **ppvVar2;
  
  __ptr = (stack *)malloc(0x18);
  if (__ptr != (stack *)0x0) {
    uVar1 = 0x40;
    if (0 < startingSize) {
      uVar1 = (ulong)(uint)startingSize;
    }
    ppvVar2 = (void **)malloc(uVar1 * 8);
    __ptr->element = ppvVar2;
    if (ppvVar2 != (void **)0x0) {
      __ptr->size = 0;
      __ptr->capacity = uVar1;
      return __ptr;
    }
    free(__ptr);
  }
  return (stack *)0x0;
}

Assistant:

stack * stack_new(int startingSize) {
	stack * s = malloc(sizeof(stack));

	if (s) {
		if (startingSize <= 0) {
			startingSize = kStackStartingSize;
		}

		s->element = malloc(sizeof(void *) * startingSize);

		if (!s->element) {
			free(s);
			return NULL;
		}

		s->size = 0;
		s->capacity = startingSize;
	}

	return s;
}